

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status leveldb::DestroyDB(string *dbname,Options *options)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  Status *pSVar4;
  long in_RDX;
  undefined8 in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  size_t i;
  Env *env;
  Status del;
  FileType type;
  uint64_t number;
  FileLock *lock;
  Status result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  string lockname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  undefined6 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb6;
  undefined1 in_stack_fffffffffffffeb7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  Status *this;
  char *__rhs;
  undefined6 in_stack_fffffffffffffee0;
  Status *local_100;
  undefined1 local_c8 [8];
  undefined1 local_c0 [8];
  undefined1 local_b8 [8];
  undefined1 local_b0 [12];
  int local_a4;
  undefined1 local_98 [8];
  undefined8 local_90;
  char local_88 [8];
  undefined1 local_80 [56];
  undefined1 local_48 [32];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_RDX + 0x10);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffea8);
  (**(code **)((long)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&pbVar1->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start[1].
                      field_2 + 8))(local_88,pbVar1,in_RSI,local_80);
  uVar2 = Status::ok((Status *)in_stack_fffffffffffffea8);
  if ((bool)uVar2) {
    LockFileName((string *)
                 CONCAT17(in_stack_fffffffffffffeb7,
                          CONCAT16(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb0)));
    (*(code *)(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&pbVar1->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start[3].
              _M_string_length)(local_98,pbVar1,local_28,&local_90);
    __rhs = local_88;
    Status::operator=((Status *)in_stack_fffffffffffffeb8,
                      (Status *)
                      CONCAT17(in_stack_fffffffffffffeb7,
                               CONCAT16(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb0)));
    Status::~Status((Status *)in_stack_fffffffffffffea8);
    uVar3 = Status::ok((Status *)in_stack_fffffffffffffea8);
    if ((bool)uVar3) {
      local_100 = (Status *)0x0;
      while (this = local_100,
            pSVar4 = (Status *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_fffffffffffffea8), this < pSVar4) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffeb8,
                     CONCAT17(in_stack_fffffffffffffeb7,
                              CONCAT16(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb0)));
        in_stack_fffffffffffffec7 =
             ParseFileName((string *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                           (uint64_t *)in_stack_fffffffffffffeb8,
                           (FileType *)
                           CONCAT17(in_stack_fffffffffffffeb7,
                                    CONCAT16(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb0)));
        if (((bool)in_stack_fffffffffffffec7) && (local_a4 != 1)) {
          in_stack_fffffffffffffeb8 = pbVar1;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffee0)),__rhs);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffeb8,
                       CONCAT17(in_stack_fffffffffffffeb7,
                                CONCAT16(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb0)));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                         in_stack_fffffffffffffeb8);
          (*(code *)(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&in_stack_fffffffffffffeb8->_M_dataplus)->_M_impl).super__Vector_impl_data.
                    _M_start[2]._M_dataplus._M_p)(local_b0,in_stack_fffffffffffffeb8,local_48);
          std::__cxx11::string::~string(in_stack_fffffffffffffea8);
          std::__cxx11::string::~string(in_stack_fffffffffffffea8);
          in_stack_fffffffffffffeb7 = Status::ok((Status *)in_stack_fffffffffffffea8);
          if (((bool)in_stack_fffffffffffffeb7) &&
             (in_stack_fffffffffffffeb6 = Status::ok((Status *)in_stack_fffffffffffffea8),
             !(bool)in_stack_fffffffffffffeb6)) {
            Status::operator=(this,(Status *)
                                   CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
          }
          Status::~Status((Status *)in_stack_fffffffffffffea8);
        }
        local_100 = (Status *)((long)&local_100->state_ + 1);
      }
      (*(code *)(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&pbVar1->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start[3].field_2.
                _M_allocated_capacity)(local_b8,pbVar1,local_90);
      Status::~Status((Status *)in_stack_fffffffffffffea8);
      (*(code *)(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&pbVar1->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start[2]._M_dataplus
                ._M_p)(local_c0,pbVar1,local_28);
      Status::~Status((Status *)in_stack_fffffffffffffea8);
      (*(code *)(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&pbVar1->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start[2].field_2.
                _M_allocated_capacity)(local_c8,pbVar1,in_RSI);
      Status::~Status((Status *)in_stack_fffffffffffffea8);
    }
    Status::Status((Status *)in_stack_fffffffffffffea8,(Status *)0x189330e);
    std::__cxx11::string::~string(in_stack_fffffffffffffea8);
  }
  else {
    Status::OK();
  }
  Status::~Status((Status *)in_stack_fffffffffffffea8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffeb8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (Status)in_RDI;
}

Assistant:

Status DestroyDB(const std::string& dbname, const Options& options) {
  Env* env = options.env;
  std::vector<std::string> filenames;
  Status result = env->GetChildren(dbname, &filenames);
  if (!result.ok()) {
    // Ignore error in case directory does not exist
    return Status::OK();
  }

  FileLock* lock;
  const std::string lockname = LockFileName(dbname);
  result = env->LockFile(lockname, &lock);
  if (result.ok()) {
    uint64_t number;
    FileType type;
    for (size_t i = 0; i < filenames.size(); i++) {
      if (ParseFileName(filenames[i], &number, &type) &&
          type != kDBLockFile) {  // Lock file will be deleted at end
        Status del = env->DeleteFile(dbname + "/" + filenames[i]);
        if (result.ok() && !del.ok()) {
          result = del;
        }
      }
    }
    env->UnlockFile(lock);  // Ignore error since state is already gone
    env->DeleteFile(lockname);
    env->DeleteDir(dbname);  // Ignore error in case dir contains other files
  }
  return result;
}